

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void issue63(void)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _Alloc_hider _Var9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ostream *poVar13;
  runtime_error *this;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  byte *pbVar20;
  ulong uVar21;
  long lVar22;
  byte *pbVar23;
  byte *pbVar24;
  long lVar25;
  bool bVar26;
  double x;
  string a;
  
  std::__cxx11::string::string((string *)&a,"1-4-abc",(allocator *)&x);
  bVar1 = *a._M_dataplus._M_p;
  _Var9 = a._M_dataplus;
  bVar14 = bVar1;
  if (bVar1 == 0x2d) {
    bVar14 = a._M_dataplus._M_p[1];
    if ((byte)(bVar14 - 0x30) < 10) {
      _Var9._M_p = a._M_dataplus._M_p + 1;
      goto LAB_001054b3;
    }
  }
  else {
LAB_001054b3:
    if (bVar14 == 0x30) {
      bVar18 = ((byte *)_Var9._M_p)[1];
      if (9 < (byte)(bVar18 - 0x30)) {
        pbVar23 = (byte *)_Var9._M_p + 1;
        uVar21 = 0;
LAB_001054d0:
        if (bVar18 == 0x2e) {
          bVar15 = pbVar23[1] - 0x30;
          if (9 < bVar15) goto LAB_001058a6;
          pbVar20 = pbVar23 + 1;
          lVar25 = 0;
          pbVar23 = pbVar20;
          do {
            uVar21 = (ulong)bVar15 + uVar21 * 10;
            bVar18 = pbVar23[1];
            pbVar23 = pbVar23 + 1;
            bVar15 = bVar18 - 0x30;
            lVar25 = lVar25 + -1;
          } while (bVar15 < 10);
          iVar19 = (int)pbVar20 - (int)lVar25;
        }
        else {
          lVar25 = 0;
          iVar19 = (int)pbVar23;
        }
        if ((bVar18 | 0x20) == 0x65) {
          pbVar20 = pbVar23 + 1;
          bVar26 = (*pbVar20 - 0x2b & 0xfd) == 0;
          pbVar24 = pbVar23 + 1;
          if (bVar26) {
            pbVar24 = pbVar23 + 2;
          }
          bVar18 = pbVar23[(ulong)bVar26 + 1] - 0x30;
          if (9 < bVar18) goto LAB_001058a6;
          bVar15 = pbVar24[1] - 0x30;
          uVar12 = (ulong)bVar18 * 10 + (ulong)bVar15;
          if (9 < bVar15) {
            uVar12 = (ulong)bVar18;
          }
          pbVar23 = pbVar24 + 2;
          if (9 < bVar15) {
            pbVar23 = pbVar24 + 1;
          }
          bVar18 = pbVar24[(ulong)(bVar15 < 10) + 1] - 0x30;
          pbVar23 = pbVar23 + (bVar18 < 10);
          uVar11 = uVar12 * 10 + (ulong)bVar18;
          if (9 < bVar18) {
            uVar11 = uVar12;
          }
          for (; (byte)(*pbVar23 - 0x30) < 10; pbVar23 = pbVar23 + 1) {
            if ((long)uVar11 < 0x100000000) {
              uVar11 = (ulong)(byte)(*pbVar23 - 0x30) + uVar11 * 10;
            }
          }
          uVar12 = -uVar11;
          if (*pbVar20 != 0x2d) {
            uVar12 = uVar11;
          }
          lVar25 = lVar25 + uVar12;
        }
        if ((int)(~(uint)_Var9._M_p + iVar19) < 0x13) {
LAB_00105643:
          if (lVar25 - 0x135U < 0xfffffffffffffd86) goto LAB_00105652;
          if ((uVar21 >> 0x35 == 0) && (lVar25 + 0x16U < 0x2d)) {
            if (lVar25 < 0) {
              x = (double)(long)uVar21 /
                  *(double *)
                   (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                    power_of_ten + lVar25 * -8);
            }
            else {
              x = (double)(long)uVar21 *
                  *(double *)
                   (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                    power_of_ten + lVar25 * 8);
            }
            if (bVar1 == 0x2d) {
              x = -x;
            }
          }
          else {
            if (uVar21 != 0) {
              uVar12 = 0x3f;
              if (uVar21 != 0) {
                for (; uVar21 >> uVar12 == 0; uVar12 = uVar12 - 1) {
                }
              }
              uVar21 = uVar21 << ((byte)(uVar12 ^ 0x3f) & 0x3f);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar21;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64
                                       + lVar25 * 8 + 0xa28);
              auVar2 = auVar2 * auVar4;
              uVar10 = auVar2._0_8_;
              uVar11 = auVar2._8_8_ & 0x1ff;
              if ((uVar11 == 0x1ff) && (uVar11 = 0x1ff, CARRY8(uVar10,uVar21))) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar21;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                          compute_float_64(long,unsigned_long,bool,bool*)::
                                          mantissa_128 + lVar25 * 8 + 0xa28);
                uVar17 = SUB168(auVar3 * auVar5,8);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar17;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar17;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar17;
                auVar7 = auVar2 + auVar7;
                auVar6 = auVar2 + auVar6;
                uVar16 = auVar2._8_4_ + (uint)CARRY8(uVar10,uVar17) & 0x1ff;
                uVar11 = (ulong)uVar16;
                auVar2 = auVar2 + auVar8;
                if ((!CARRY8(SUB168(auVar3 * auVar5,0),uVar21)) ||
                   ((auVar2 = auVar6, uVar10 + uVar17 != -1 || (auVar2 = auVar7, uVar16 != 0x1ff))))
                goto LAB_001056eb;
              }
              else {
LAB_001056eb:
                uVar21 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
                uVar16 = (uint)uVar21;
                if ((auVar2._0_8_ != 0) || ((uVar11 != 0 || ((uVar16 & 3) != 1)))) {
                  uVar21 = (uVar16 & 1) + uVar21;
                  uVar11 = uVar21 >> 0x36;
                  uVar12 = ((lVar25 * 0x3526a >> 0x10) + 0x43f) -
                           ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar12 ^ 0x3f) + -1 + (ulong)(uVar11 == 0)
                           );
                  if ((uVar12 != 0) && (uVar12 < 0x7ff)) {
                    uVar10 = 0;
                    if (uVar11 == 0) {
                      uVar10 = uVar21 >> 1 & 0xefffffffffffff;
                    }
                    x = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar10 | uVar12 << 0x34);
                    goto LAB_001057c9;
                  }
                }
              }
              x = 0.0;
              goto LAB_00105652;
            }
            if (bVar1 == 0x2d) {
              x = -0.0;
            }
            else {
              x = 0.0;
            }
          }
        }
        else {
          lVar22 = 1;
          while ((bVar14 == 0x30 || (bVar14 == 0x2e))) {
            pbVar20 = (byte *)_Var9._M_p + lVar22;
            lVar22 = lVar22 + 1;
            bVar14 = *pbVar20;
          }
          if ((int)((iVar19 - (uint)_Var9._M_p) - (int)lVar22) < 0x13) goto LAB_00105643;
LAB_00105652:
          pbVar23 = (byte *)fast_double_parser::parse_float_strtod(a._M_dataplus._M_p,&x);
          if (pbVar23 == (byte *)0x0) goto LAB_001058a6;
        }
LAB_001057c9:
        if (pbVar23 == (byte *)(a._M_dataplus._M_p + 1)) {
          if ((x == 1.0) && (!NAN(x))) {
            poVar13 = std::operator<<((ostream *)&std::cout,"1-4-abc");
            std::endl<char,std::char_traits<char>>(poVar13);
            std::__cxx11::string::~string((string *)&a);
            return;
          }
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"cannot parse 1.");
        }
        else {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"does not point at the next number");
        }
        goto LAB_001058f8;
      }
    }
    else if ((byte)(bVar14 - 0x30) < 10) {
      uVar21 = (ulong)(byte)(bVar14 - 0x30);
      pbVar23 = (byte *)_Var9._M_p;
      while( true ) {
        pbVar23 = pbVar23 + 1;
        bVar18 = *pbVar23;
        if (9 < (byte)(bVar18 - 0x30)) break;
        uVar21 = (ulong)(byte)(bVar18 - 0x30) + uVar21 * 10;
      }
      goto LAB_001054d0;
    }
  }
LAB_001058a6:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"1-4-abc");
LAB_001058f8:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void issue63() {
  std::string a = "1-4-abc";
  double x;
  const char * ok = fast_double_parser::parse_number(a.c_str(), &x);
  if(!ok) throw std::runtime_error("1-4-abc");
  if(ok != a.c_str() + 1) throw std::runtime_error("does not point at the next number");
  if(x != 1) throw std::runtime_error("cannot parse 1.");
  std::cout << "1-4-abc" << std::endl;
}